

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O2

Ptr __thiscall core::image::expand_grayscale<unsigned_char>(image *this,ConstPtr *image)

{
  int iVar1;
  element_type *peVar2;
  int iVar3;
  invalid_argument *this_00;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  long lVar6;
  long lVar7;
  Ptr PVar8;
  
  peVar2 = (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
  }
  else {
    iVar1 = (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
    if (0xfffffffd < iVar1 - 3U) {
      Image<unsigned_char>::create();
      peVar2 = (image->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      TypedImageBase<unsigned_char>::allocate
                (*(TypedImageBase<unsigned_char> **)this,
                 (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.w,
                 (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.h,(iVar1 == 2) + 3);
      peVar2 = (image->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      iVar3 = (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.h *
              (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
      iVar4 = 0;
      _Var5._M_pi = extraout_RDX;
      if (iVar3 < 1) {
        iVar3 = iVar4;
      }
      for (; iVar3 != iVar4; iVar4 = iVar4 + 1) {
        peVar2 = (image->
                 super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)iVar4;
        *(uchar *)(*(long *)(*(long *)this + 0x18) +
                  (long)*(int *)(*(long *)this + 0x10) * (long)_Var5._M_pi) =
             (peVar2->super_TypedImageBase<unsigned_char>).data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start
             [(long)(peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.c *
              (long)_Var5._M_pi];
        peVar2 = (image->
                 super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        *(uchar *)(*(long *)(*(long *)this + 0x18) + 1 +
                  (long)*(int *)(*(long *)this + 0x10) * (long)_Var5._M_pi) =
             (peVar2->super_TypedImageBase<unsigned_char>).data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start
             [(long)(peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.c *
              (long)_Var5._M_pi];
        peVar2 = (image->
                 super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        *(uchar *)(*(long *)(*(long *)this + 0x18) + 2 +
                  (long)*(int *)(*(long *)this + 0x10) * (long)_Var5._M_pi) =
             (peVar2->super_TypedImageBase<unsigned_char>).data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start
             [(long)(peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.c *
              (long)_Var5._M_pi];
        if (iVar1 == 2) {
          peVar2 = (image->
                   super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
          lVar6 = (long)(peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.c *
                  (long)_Var5._M_pi;
          lVar7 = (long)*(int *)(*(long *)this + 0x10) * (long)_Var5._M_pi;
          _Var5._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x18);
          *(uchar *)((long)&(_Var5._M_pi)->_vptr__Sp_counted_base + lVar7 + 3) =
               (peVar2->super_TypedImageBase<unsigned_char>).data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[lVar6 + 1];
        }
      }
      PVar8.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var5._M_pi;
      PVar8.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Ptr)PVar8.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Image must be in G or GA");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typename Image<T>::Ptr
expand_grayscale (typename Image<T>::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    int const ic = image->channels();
    if (ic != 1 && ic != 2)
        throw std::invalid_argument("Image must be in G or GA");

    bool const has_alpha = (ic == 2);

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(image->width(), image->height(), 3 + has_alpha);

    int pixels = image->get_pixel_amount();
    for (int i = 0; i < pixels; ++i)
    {
        out->at(i, 0) = image->at(i, 0);
        out->at(i, 1) = image->at(i, 0);
        out->at(i, 2) = image->at(i, 0);
        if (has_alpha)
            out->at(i, 3) = image->at(i, 1);
    }

    return out;
}